

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::fixup_pvrtc1_4_modulation_rgb
               (decoder_etc_block *pETC_Blocks,uint32_t *pPVRTC_endpoints,void *pDst_blocks,
               uint32_t num_blocks_x,uint32_t num_blocks_y)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint in_ECX;
  long lVar8;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  uint32_t m_15;
  int p_15;
  int vl_15;
  int dl_15;
  int cl_15;
  int cb_l_15;
  int ca_l_15;
  uint32_t m_14;
  int p_14;
  int vl_14;
  int dl_14;
  int cl_14;
  int cb_l_14;
  int ca_l_14;
  uint32_t m_13;
  int p_13;
  int vl_13;
  int dl_13;
  int cl_13;
  int cb_l_13;
  int ca_l_13;
  uint32_t m_12;
  int p_12;
  int vl_12;
  int dl_12;
  int cl_12;
  int cb_l_12;
  int ca_l_12;
  int b3_3;
  int b2_3;
  int b1_3;
  int b0_3;
  int a3_3;
  int a2_3;
  int a1_3;
  int a0_3;
  uint32_t ey_4;
  uint32_t ex_5;
  uint32_t m_11;
  int p_11;
  int vl_11;
  int dl_11;
  int cl_11;
  int cb_l_11;
  int ca_l_11;
  uint32_t m_10;
  int p_10;
  int vl_10;
  int dl_10;
  int cl_10;
  int cb_l_10;
  int ca_l_10;
  uint32_t m_9;
  int p_9;
  int vl_9;
  int dl_9;
  int cl_9;
  int cb_l_9;
  int ca_l_9;
  uint32_t m_8;
  int p_8;
  int vl_8;
  int dl_8;
  int cl_8;
  int cb_l_8;
  int ca_l_8;
  int b3_2;
  int b2_2;
  int b1_2;
  int b0_2;
  int a3_2;
  int a2_2;
  int a1_2;
  int a0_2;
  uint32_t ey_3;
  uint32_t ex_4;
  uint32_t m_7;
  int p_7;
  int vl_7;
  int dl_7;
  int cl_7;
  int cb_l_7;
  int ca_l_7;
  uint32_t m_6;
  int p_6;
  int vl_6;
  int dl_6;
  int cl_6;
  int cb_l_6;
  int ca_l_6;
  uint32_t m_5;
  int p_5;
  int vl_5;
  int dl_5;
  int cl_5;
  int cb_l_5;
  int ca_l_5;
  uint32_t m_4;
  int p_4;
  int vl_4;
  int dl_4;
  int cl_4;
  int cb_l_4;
  int ca_l_4;
  int b3_1;
  int b2_1;
  int b1_1;
  int b0_1;
  int a3_1;
  int a2_1;
  int a1_1;
  int a0_1;
  uint32_t ey_2;
  uint32_t ex_3;
  uint32_t m_3;
  int p_3;
  int vl_3;
  int dl_3;
  int cl_3;
  int cb_l_3;
  int ca_l_3;
  uint32_t m_2;
  int p_2;
  int vl_2;
  int dl_2;
  int cl_2;
  int cb_l_2;
  int ca_l_2;
  uint32_t m_1;
  int p_1;
  int vl_1;
  int dl_1;
  int cl_1;
  int cb_l_1;
  int ca_l_1;
  uint32_t m;
  int p;
  int vl;
  int dl;
  int cl;
  int cb_l;
  int ca_l;
  int b3;
  int b2;
  int b1;
  int b0;
  int a3;
  int a2;
  int a1;
  int a0;
  uint32_t ey_1;
  uint32_t ex_2;
  uint32_t msb_bits_3;
  uint32_t lsb_bits_3;
  uint32_t byte_ofs_3;
  uint32_t msb_bits_2;
  uint32_t lsb_bits_2;
  uint32_t byte_ofs_2;
  uint32_t msb_bits_1;
  uint32_t lsb_bits_1;
  uint32_t byte_ofs_1;
  uint32_t msb_bits;
  uint32_t lsb_bits;
  uint32_t byte_ofs;
  uint32_t lookup_x [4];
  uint32_t mod;
  uint32_t e_3;
  uint32_t e_2;
  uint32_t e_1;
  int bx_1;
  uint32_t ex_1;
  int block_colors_y_x16 [4];
  int by_1;
  int *pInten_table48;
  uint32_t base_b;
  uint32_t base_g;
  uint32_t base_r;
  pvrtc4_block *pDst_block;
  uint32_t swizzled;
  uint32_t x_swizzle;
  decoder_etc_block *src_block;
  int x;
  uint32_t y_swizzle;
  uint32_t e;
  int bx;
  int ex;
  uint32_t *pE;
  int by;
  int ey;
  uint32_t *pE_rows [3];
  int y;
  int e1 [4] [4];
  int e0 [4] [4];
  uint32_t block_index;
  uint32_t swizzle_mask;
  uint32_t min_bits;
  uint32_t y_bits;
  uint32_t x_bits;
  uint32_t y_mask;
  uint32_t x_mask;
  uint local_418;
  int local_414;
  uint32_t in_stack_fffffffffffffbf4;
  uint local_3fc;
  int local_3f8;
  int local_3f0;
  uint local_3e0;
  int local_3dc;
  int local_3d4;
  uint local_3c4;
  int local_3c0;
  int local_3b8;
  uint local_380;
  int local_37c;
  int local_374;
  uint local_364;
  int local_360;
  int local_358;
  uint local_348;
  int local_344;
  int local_33c;
  uint local_32c;
  int local_328;
  int local_320;
  uint local_2e8;
  int local_2e4;
  int local_2dc;
  uint local_2cc;
  int local_2c8;
  int local_2c0;
  uint local_2b0;
  int local_2ac;
  int local_2a4;
  uint local_294;
  int local_290;
  int local_288;
  uint local_250;
  int local_24c;
  int local_244;
  uint local_234;
  int local_230;
  int local_228;
  uint local_218;
  int local_214;
  int local_20c;
  uint local_1fc;
  int local_1f8;
  int local_1f0;
  int local_158 [5];
  int local_144;
  int *local_140;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint *local_128;
  uint local_120;
  uint local_11c;
  uint *local_118;
  uint local_10c;
  uint local_108;
  undefined4 local_104;
  uint local_100;
  int local_fc;
  long local_f8;
  uint local_f0;
  int local_ec;
  long local_e8 [3];
  uint local_cc;
  uint local_c8 [4];
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_88 [4];
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint32_t local_30;
  uint local_2c;
  uint32_t local_28;
  uint32_t local_24;
  uint local_20;
  uint local_1c;
  long local_18;
  long local_10;
  long local_8;
  
  local_24 = in_ECX - 1;
  local_28 = in_R8D - 1;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_2c = basisu::total_bits(local_24);
  local_30 = basisu::total_bits(local_28);
  local_34 = basisu::minimum<unsigned_int>(local_2c,local_30);
  local_38 = (1 << ((byte)(local_34 << 1) & 0x1f)) - 1;
  local_3c = 0;
  for (local_cc = 0; (int)local_cc < (int)local_20; local_cc = local_cc + 1) {
    for (local_ec = 0; local_ec < 3; local_ec = local_ec + 1) {
      local_f0 = (local_cc + local_ec) - 1;
      local_f8 = local_10 + (ulong)((local_f0 & local_28) * local_1c) * 4;
      local_e8[local_ec] = local_f8;
      for (local_fc = 0; local_fc < 3; local_fc = local_fc + 1) {
        local_100 = local_fc - 1;
        local_104 = *(undefined4 *)(local_f8 + (ulong)(local_100 & local_24) * 4);
        uVar1 = get_opaque_endpoint_l0(in_stack_fffffffffffffbf4);
        local_88[(long)local_fc * 4 + (long)local_ec] = (uVar1 * 0xff) / 0x1f;
        uVar1 = get_opaque_endpoint_l1(in_stack_fffffffffffffbf4);
        local_c8[(long)local_fc * 4 + (long)local_ec] = (uVar1 * 0xff) / 0x1f;
      }
    }
    local_108 = CONCAT22(*(undefined2 *)(&g_pvrtc_swizzle_table + (long)((int)local_cc >> 8) * 2),
                         *(undefined2 *)(&g_pvrtc_swizzle_table + (long)(int)(local_cc & 0xff) * 2))
    ;
    for (local_10c = 0; (int)local_10c < (int)local_1c; local_10c = local_10c + 1) {
      local_118 = (uint *)(local_8 + (ulong)local_3c * 8);
      local_11c = (uint)*(ushort *)(&g_pvrtc_swizzle_table + (long)((int)local_10c >> 8) * 2) <<
                  0x11 | (uint)*(ushort *)
                                (&g_pvrtc_swizzle_table + (long)(int)(local_10c & 0xff) * 2) << 1;
      local_120 = local_11c | local_108;
      if (local_1c != local_20) {
        if (local_20 < local_1c) {
          uVar2 = ((int)local_10c >> ((byte)local_34 & 0x1f)) << ((byte)(local_34 << 1) & 0x1f);
        }
        else {
          uVar2 = ((int)local_cc >> ((byte)local_34 & 0x1f)) << ((byte)(local_34 << 1) & 0x1f);
        }
        local_120 = uVar2 | local_38 & local_120;
      }
      local_128 = (uint *)(local_18 + (ulong)local_120 * 8);
      local_128[1] = *(uint *)(local_10 + (ulong)local_3c * 4);
      local_12c = (uint)(byte)g_etc_5_to_8[*local_118 >> 3 & 0x1f];
      local_130 = (uint)(byte)g_etc_5_to_8[*local_118 >> 0xb & 0x1f];
      local_134 = (uint)(byte)g_etc_5_to_8[*local_118 >> 0x13 & 0x1f];
      lVar8 = (ulong)(*local_118 >> 0x1d) * 0x10;
      local_140 = (int *)(g_etc1_inten_tables48 + lVar8);
      local_144 = (local_12c + local_130 + local_134) * 0x10;
      local_158[0] = local_144 + *(int *)(g_etc1_inten_tables48 + lVar8 + 8);
      local_158[1] = local_144 + *(int *)(g_etc1_inten_tables48 + lVar8 + 0xc);
      local_158[2] = local_144 + *(int *)(g_etc1_inten_tables48 + lVar8 + 4);
      local_158[3] = local_144 + *local_140;
      uVar1 = get_opaque_endpoint_l0(in_stack_fffffffffffffbf4);
      local_68 = (uVar1 * 0xff) / 0x1f;
      uVar1 = get_opaque_endpoint_l1(in_stack_fffffffffffffbf4);
      local_a8 = (uVar1 * 0xff) / 0x1f;
      uVar1 = get_opaque_endpoint_l0(in_stack_fffffffffffffbf4);
      local_64 = (uVar1 * 0xff) / 0x1f;
      uVar1 = get_opaque_endpoint_l1(in_stack_fffffffffffffbf4);
      local_a4 = (uVar1 * 0xff) / 0x1f;
      uVar1 = get_opaque_endpoint_l0(in_stack_fffffffffffffbf4);
      local_60 = (uVar1 * 0xff) / 0x1f;
      uVar1 = get_opaque_endpoint_l1(in_stack_fffffffffffffbf4);
      local_a0 = (uVar1 * 0xff) / 0x1f;
      uVar2 = *(byte *)((long)local_118 + 7) & 0xf | (*(byte *)((long)local_118 + 5) & 0xf) << 4;
      uVar3 = (int)(uint)*(byte *)((long)local_118 + 7) >> 4 |
              ((int)(uint)*(byte *)((long)local_118 + 5) >> 4) << 4;
      uVar4 = *(byte *)((long)local_118 + 6) & 0xf | ((byte)local_118[1] & 0xf) << 4;
      uVar5 = (int)(uint)*(byte *)((long)local_118 + 6) >> 4 |
              ((int)(uint)(byte)local_118[1] >> 4) << 4;
      iVar6 = local_88[0] * 4 + local_78 * 4 + local_88[1] * 4 + local_74 * 4;
      iVar7 = local_c8[0] * 4 + local_b8 * 4 + local_c8[1] * 4 + local_b4 * 4;
      local_1f0 = iVar7 - iVar6;
      local_1f8 = (local_158[(byte)g_etc1_x_selector_unpack[uVar2]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_1f8 = (local_158[(byte)g_etc1_x_selector_unpack[uVar2]] - iVar6) * -0x10;
        local_1f0 = -local_1f0;
      }
      local_1fc = (uint)(local_1f8 != local_1f0 * 3 &&
                        SBORROW4(local_1f8,local_1f0 * 3) == local_1f8 + local_1f0 * -3 < 0);
      if (local_1f0 * 8 < local_1f8) {
        local_1fc = 2;
      }
      if (local_1f8 != local_1f0 * 0xd &&
          SBORROW4(local_1f8,local_1f0 * 0xd) == local_1f8 + local_1f0 * -0xd < 0) {
        local_1fc = 3;
      }
      iVar6 = local_88[0] * 2 + local_78 * 6 + local_88[1] * 2 + local_74 * 6;
      iVar7 = local_c8[0] * 2 + local_b8 * 6 + local_c8[1] * 2 + local_b4 * 6;
      local_20c = iVar7 - iVar6;
      local_214 = (local_158[(byte)g_etc1_x_selector_unpack[uVar3]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_214 = (local_158[(byte)g_etc1_x_selector_unpack[uVar3]] - iVar6) * -0x10;
        local_20c = -local_20c;
      }
      local_218 = 0;
      if (local_214 != local_20c * 3 &&
          SBORROW4(local_214,local_20c * 3) == local_214 + local_20c * -3 < 0) {
        local_218 = 4;
      }
      if (local_20c * 8 < local_214) {
        local_218 = 8;
      }
      if (local_214 != local_20c * 0xd &&
          SBORROW4(local_214,local_20c * 0xd) == local_214 + local_20c * -0xd < 0) {
        local_218 = 0xc;
      }
      iVar6 = local_88[0] * 2 + local_78 * 2 + local_88[1] * 6 + local_74 * 6;
      iVar7 = local_c8[0] * 2 + local_b8 * 2 + local_c8[1] * 6 + local_b4 * 6;
      local_228 = iVar7 - iVar6;
      local_230 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar2 + 0x100]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_230 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar2 + 0x100]] - iVar6) *
                    -0x10;
        local_228 = -local_228;
      }
      local_234 = 0;
      if (local_230 != local_228 * 3 &&
          SBORROW4(local_230,local_228 * 3) == local_230 + local_228 * -3 < 0) {
        local_234 = 0x100;
      }
      if (local_228 * 8 < local_230) {
        local_234 = 0x200;
      }
      if (local_230 != local_228 * 0xd &&
          SBORROW4(local_230,local_228 * 0xd) == local_230 + local_228 * -0xd < 0) {
        local_234 = 0x300;
      }
      iVar6 = local_88[0] + local_78 * 3 + local_88[1] * 3 + local_74 * 9;
      iVar7 = local_c8[0] + local_b8 * 3 + local_c8[1] * 3 + local_b4 * 9;
      local_244 = iVar7 - iVar6;
      local_24c = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar3 + 0x100]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_24c = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar3 + 0x100]] - iVar6) *
                    -0x10;
        local_244 = -local_244;
      }
      local_250 = 0;
      if (local_24c != local_244 * 3 &&
          SBORROW4(local_24c,local_244 * 3) == local_24c + local_244 * -3 < 0) {
        local_250 = 0x400;
      }
      if (local_244 * 8 < local_24c) {
        local_250 = 0x800;
      }
      if (local_24c != local_244 * 0xd &&
          SBORROW4(local_24c,local_244 * 0xd) == local_24c + local_244 * -0xd < 0) {
        local_250 = 0xc00;
      }
      iVar6 = local_78 * 8 + local_74 * 8;
      iVar7 = local_b8 * 8 + local_b4 * 8;
      local_288 = iVar7 - iVar6;
      local_290 = (local_158[(byte)g_etc1_x_selector_unpack[uVar4]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_290 = (local_158[(byte)g_etc1_x_selector_unpack[uVar4]] - iVar6) * -0x10;
        local_288 = -local_288;
      }
      local_294 = 0;
      if (local_290 != local_288 * 3 &&
          SBORROW4(local_290,local_288 * 3) == local_290 + local_288 * -3 < 0) {
        local_294 = 0x10;
      }
      if (local_288 * 8 < local_290) {
        local_294 = 0x20;
      }
      if (local_290 != local_288 * 0xd &&
          SBORROW4(local_290,local_288 * 0xd) == local_290 + local_288 * -0xd < 0) {
        local_294 = 0x30;
      }
      iVar6 = local_78 * 6 + local_68 * 2 + local_74 * 6 + local_64 * 2;
      iVar7 = local_b8 * 6 + local_a8 * 2 + local_b4 * 6 + local_a4 * 2;
      local_2a4 = iVar7 - iVar6;
      local_2ac = (local_158[(byte)g_etc1_x_selector_unpack[uVar5]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_2ac = (local_158[(byte)g_etc1_x_selector_unpack[uVar5]] - iVar6) * -0x10;
        local_2a4 = -local_2a4;
      }
      local_2b0 = 0;
      if (local_2ac != local_2a4 * 3 &&
          SBORROW4(local_2ac,local_2a4 * 3) == local_2ac + local_2a4 * -3 < 0) {
        local_2b0 = 0x40;
      }
      if (local_2a4 * 8 < local_2ac) {
        local_2b0 = 0x80;
      }
      if (local_2ac != local_2a4 * 0xd &&
          SBORROW4(local_2ac,local_2a4 * 0xd) == local_2ac + local_2a4 * -0xd < 0) {
        local_2b0 = 0xc0;
      }
      iVar6 = local_78 * 4 + local_74 * 0xc;
      iVar7 = local_b8 * 4 + local_b4 * 0xc;
      local_2c0 = iVar7 - iVar6;
      local_2c8 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar4 + 0x100]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_2c8 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar4 + 0x100]] - iVar6) *
                    -0x10;
        local_2c0 = -local_2c0;
      }
      local_2cc = 0;
      if (local_2c8 != local_2c0 * 3 &&
          SBORROW4(local_2c8,local_2c0 * 3) == local_2c8 + local_2c0 * -3 < 0) {
        local_2cc = 0x1000;
      }
      if (local_2c0 * 8 < local_2c8) {
        local_2cc = 0x2000;
      }
      if (local_2c8 != local_2c0 * 0xd &&
          SBORROW4(local_2c8,local_2c0 * 0xd) == local_2c8 + local_2c0 * -0xd < 0) {
        local_2cc = 0x3000;
      }
      iVar6 = local_78 * 3 + local_68 + local_74 * 9 + local_64 * 3;
      iVar7 = local_b8 * 3 + local_a8 + local_b4 * 9 + local_a4 * 3;
      local_2dc = iVar7 - iVar6;
      local_2e4 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar5 + 0x100]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_2e4 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar5 + 0x100]] - iVar6) *
                    -0x10;
        local_2dc = -local_2dc;
      }
      local_2e8 = 0;
      if (local_2e4 != local_2dc * 3 &&
          SBORROW4(local_2e4,local_2dc * 3) == local_2e4 + local_2dc * -3 < 0) {
        local_2e8 = 0x4000;
      }
      if (local_2dc * 8 < local_2e4) {
        local_2e8 = 0x8000;
      }
      if (local_2e4 != local_2dc * 0xd &&
          SBORROW4(local_2e4,local_2dc * 0xd) == local_2e4 + local_2dc * -0xd < 0) {
        local_2e8 = 0xc000;
      }
      iVar6 = local_88[1] * 8 + local_74 * 8;
      iVar7 = local_c8[1] * 8 + local_b4 * 8;
      local_320 = iVar7 - iVar6;
      local_328 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar2 + 0x200]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_328 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar2 + 0x200]] - iVar6) *
                    -0x10;
        local_320 = -local_320;
      }
      local_32c = 0;
      if (local_328 != local_320 * 3 &&
          SBORROW4(local_328,local_320 * 3) == local_328 + local_320 * -3 < 0) {
        local_32c = 0x10000;
      }
      if (local_320 * 8 < local_328) {
        local_32c = 0x20000;
      }
      if (local_328 != local_320 * 0xd &&
          SBORROW4(local_328,local_320 * 0xd) == local_328 + local_320 * -0xd < 0) {
        local_32c = 0x30000;
      }
      iVar6 = local_88[1] * 4 + local_74 * 0xc;
      iVar7 = local_c8[1] * 4 + local_b4 * 0xc;
      local_33c = iVar7 - iVar6;
      local_344 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar3 + 0x200]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_344 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar3 + 0x200]] - iVar6) *
                    -0x10;
        local_33c = -local_33c;
      }
      local_348 = 0;
      if (local_344 != local_33c * 3 &&
          SBORROW4(local_344,local_33c * 3) == local_344 + local_33c * -3 < 0) {
        local_348 = 0x40000;
      }
      if (local_33c * 8 < local_344) {
        local_348 = 0x80000;
      }
      if (local_344 != local_33c * 0xd &&
          SBORROW4(local_344,local_33c * 0xd) == local_344 + local_33c * -0xd < 0) {
        local_348 = 0xc0000;
      }
      iVar6 = local_88[1] * 6 + local_74 * 6 + local_88[2] * 2 + local_70 * 2;
      iVar7 = local_c8[1] * 6 + local_b4 * 6 + local_c8[2] * 2 + local_b0 * 2;
      local_358 = iVar7 - iVar6;
      local_360 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar2 + 0x300]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_360 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar2 + 0x300]] - iVar6) *
                    -0x10;
        local_358 = -local_358;
      }
      local_364 = 0;
      if (local_360 != local_358 * 3 &&
          SBORROW4(local_360,local_358 * 3) == local_360 + local_358 * -3 < 0) {
        local_364 = 0x1000000;
      }
      if (local_358 * 8 < local_360) {
        local_364 = 0x2000000;
      }
      if (local_360 != local_358 * 0xd &&
          SBORROW4(local_360,local_358 * 0xd) == local_360 + local_358 * -0xd < 0) {
        local_364 = 0x3000000;
      }
      iVar6 = local_88[1] * 3 + local_74 * 9 + local_88[2] + local_70 * 3;
      iVar7 = local_c8[1] * 3 + local_b4 * 9 + local_c8[2] + local_b0 * 3;
      local_374 = iVar7 - iVar6;
      local_37c = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar3 + 0x300]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_37c = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar3 + 0x300]] - iVar6) *
                    -0x10;
        local_374 = -local_374;
      }
      local_380 = 0;
      if (local_37c != local_374 * 3 &&
          SBORROW4(local_37c,local_374 * 3) == local_37c + local_374 * -3 < 0) {
        local_380 = 0x4000000;
      }
      if (local_374 * 8 < local_37c) {
        local_380 = 0x8000000;
      }
      if (local_37c != local_374 * 0xd &&
          SBORROW4(local_37c,local_374 * 0xd) == local_37c + local_374 * -0xd < 0) {
        local_380 = 0xc000000;
      }
      local_3b8 = local_b4 * 0x10 + local_74 * -0x10;
      iVar6 = local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar4 + 0x200]] + local_74 * -0x10;
      local_3c0 = iVar6 * 0x10;
      if ((int)(local_b4 * 0x10) < (int)(local_74 * 0x10)) {
        local_3c0 = iVar6 * -0x10;
        local_3b8 = -local_3b8;
      }
      local_3c4 = 0;
      if (local_3c0 != local_3b8 * 3 &&
          SBORROW4(local_3c0,local_3b8 * 3) == local_3c0 + local_3b8 * -3 < 0) {
        local_3c4 = 0x100000;
      }
      if (local_3b8 * 8 < local_3c0) {
        local_3c4 = 0x200000;
      }
      if (local_3c0 != local_3b8 * 0xd &&
          SBORROW4(local_3c0,local_3b8 * 0xd) == local_3c0 + local_3b8 * -0xd < 0) {
        local_3c4 = 0x300000;
      }
      iVar6 = local_74 * 0xc + local_64 * 4;
      iVar7 = local_b4 * 0xc + local_a4 * 4;
      local_3d4 = iVar7 - iVar6;
      local_3dc = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar5 + 0x200]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_3dc = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar5 + 0x200]] - iVar6) *
                    -0x10;
        local_3d4 = -local_3d4;
      }
      local_3e0 = 0;
      if (local_3dc != local_3d4 * 3 &&
          SBORROW4(local_3dc,local_3d4 * 3) == local_3dc + local_3d4 * -3 < 0) {
        local_3e0 = 0x400000;
      }
      if (local_3d4 * 8 < local_3dc) {
        local_3e0 = 0x800000;
      }
      if (local_3dc != local_3d4 * 0xd &&
          SBORROW4(local_3dc,local_3d4 * 0xd) == local_3dc + local_3d4 * -0xd < 0) {
        local_3e0 = 0xc00000;
      }
      iVar6 = local_74 * 0xc + local_70 * 4;
      iVar7 = local_b4 * 0xc + local_b0 * 4;
      local_3f0 = iVar7 - iVar6;
      local_3f8 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar4 + 0x300]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_3f8 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar4 + 0x300]] - iVar6) *
                    -0x10;
        local_3f0 = -local_3f0;
      }
      local_3fc = 0;
      if (local_3f8 != local_3f0 * 3 &&
          SBORROW4(local_3f8,local_3f0 * 3) == local_3f8 + local_3f0 * -3 < 0) {
        local_3fc = 0x10000000;
      }
      if (local_3f0 * 8 < local_3f8) {
        local_3fc = 0x20000000;
      }
      if (local_3f8 != local_3f0 * 0xd &&
          SBORROW4(local_3f8,local_3f0 * 0xd) == local_3f8 + local_3f0 * -0xd < 0) {
        local_3fc = 0x30000000;
      }
      iVar6 = local_74 * 9 + local_64 * 3 + local_70 * 3 + local_60;
      iVar7 = local_b4 * 9 + local_a4 * 3 + local_b0 * 3 + local_a0;
      in_stack_fffffffffffffbf4 = iVar7 - iVar6;
      local_414 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar5 + 0x300]] - iVar6) * 0x10;
      if (iVar7 < iVar6) {
        local_414 = (local_158[(byte)g_etc1_x_selector_unpack[(ulong)uVar5 + 0x300]] - iVar6) *
                    -0x10;
        in_stack_fffffffffffffbf4 = -in_stack_fffffffffffffbf4;
      }
      local_418 = 0;
      if (local_414 != in_stack_fffffffffffffbf4 * 3 &&
          SBORROW4(local_414,in_stack_fffffffffffffbf4 * 3) ==
          (int)(local_414 + in_stack_fffffffffffffbf4 * -3) < 0) {
        local_418 = 0x40000000;
      }
      if ((int)(in_stack_fffffffffffffbf4 * 8) < local_414) {
        local_418 = 0x80000000;
      }
      if (local_414 != in_stack_fffffffffffffbf4 * 0xd &&
          SBORROW4(local_414,in_stack_fffffffffffffbf4 * 0xd) ==
          (int)(local_414 + in_stack_fffffffffffffbf4 * -0xd) < 0) {
        local_418 = 0xc0000000;
      }
      *local_128 = local_418 |
                   local_3fc |
                   local_3e0 |
                   local_3c4 |
                   local_380 |
                   local_364 |
                   local_348 |
                   local_32c |
                   local_2e8 |
                   local_2cc | local_2b0 | local_294 | local_250 | local_234 | local_218 | local_1fc
      ;
      local_88[0] = local_78;
      local_78 = local_68;
      local_88[1] = local_74;
      local_74 = local_64;
      local_88[2] = local_70;
      local_70 = local_60;
      local_c8[0] = local_b8;
      local_b8 = local_a8;
      local_c8[1] = local_b4;
      local_b4 = local_a4;
      local_c8[2] = local_b0;
      local_3c = local_3c + 1;
      local_b0 = local_a0;
    }
  }
  return;
}

Assistant:

static void fixup_pvrtc1_4_modulation_rgb(const decoder_etc_block* pETC_Blocks, const uint32_t* pPVRTC_endpoints, void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y)
	{
		const uint32_t x_mask = num_blocks_x - 1;
		const uint32_t y_mask = num_blocks_y - 1;
		const uint32_t x_bits = basisu::total_bits(x_mask);
		const uint32_t y_bits = basisu::total_bits(y_mask);
		const uint32_t min_bits = basisu::minimum(x_bits, y_bits);
		//const uint32_t max_bits = basisu::maximum(x_bits, y_bits);
		const uint32_t swizzle_mask = (1 << (min_bits * 2)) - 1;

		uint32_t block_index = 0;

		// really 3x3
		int e0[4][4], e1[4][4];

		for (int y = 0; y < static_cast<int>(num_blocks_y); y++)
		{
			const uint32_t* pE_rows[3];

			for (int ey = 0; ey < 3; ey++)
			{
				int by = y + ey - 1; 

				const uint32_t* pE = &pPVRTC_endpoints[(by & y_mask) * num_blocks_x];

				pE_rows[ey] = pE;

				for (int ex = 0; ex < 3; ex++)
				{
					int bx = 0 + ex - 1; 

					const uint32_t e = pE[bx & x_mask];

					e0[ex][ey] = (get_opaque_endpoint_l0(e) * 255) / 31;
					e1[ex][ey] = (get_opaque_endpoint_l1(e) * 255) / 31;
				}
			}

			const uint32_t y_swizzle = (g_pvrtc_swizzle_table[y >> 8] << 16) | g_pvrtc_swizzle_table[y & 0xFF];

			for (int x = 0; x < static_cast<int>(num_blocks_x); x++, block_index++)
			{
				const decoder_etc_block& src_block = pETC_Blocks[block_index];

				const uint32_t x_swizzle = (g_pvrtc_swizzle_table[x >> 8] << 17) | (g_pvrtc_swizzle_table[x & 0xFF] << 1);

				uint32_t swizzled = x_swizzle | y_swizzle;
				if (num_blocks_x != num_blocks_y)
				{
					swizzled &= swizzle_mask;

					if (num_blocks_x > num_blocks_y)
						swizzled |= ((x >> min_bits) << (min_bits * 2));
					else
						swizzled |= ((y >> min_bits) << (min_bits * 2));
				}

				pvrtc4_block* pDst_block = static_cast<pvrtc4_block*>(pDst_blocks) + swizzled;
				pDst_block->m_endpoints = pPVRTC_endpoints[block_index];

				uint32_t base_r = g_etc_5_to_8[src_block.m_differential.m_red1];
				uint32_t base_g = g_etc_5_to_8[src_block.m_differential.m_green1];
				uint32_t base_b = g_etc_5_to_8[src_block.m_differential.m_blue1];

				const int* pInten_table48 = g_etc1_inten_tables48[src_block.m_differential.m_cw1];
				int by = (base_r + base_g + base_b) * 16;
				int block_colors_y_x16[4];
				block_colors_y_x16[0] = by + pInten_table48[2];
				block_colors_y_x16[1] = by + pInten_table48[3];
				block_colors_y_x16[2] = by + pInten_table48[1];
				block_colors_y_x16[3] = by + pInten_table48[0];

				{
					const uint32_t ex = 2;
					int bx = x + ex - 1;
					bx &= x_mask;

#define DO_ROW(ey) \
					{ \
						const uint32_t e = pE_rows[ey][bx]; \
						e0[ex][ey] = (get_opaque_endpoint_l0(e) * 255) / 31; \
						e1[ex][ey] = (get_opaque_endpoint_l1(e) * 255) / 31; \
					}

					DO_ROW(0);
					DO_ROW(1);
					DO_ROW(2);
#undef DO_ROW
				}

				uint32_t mod = 0;

				uint32_t lookup_x[4];

#define DO_LOOKUP(lx) { \
					const uint32_t byte_ofs = 7 - (((lx) * 4) >> 3); \
					const uint32_t lsb_bits = src_block.m_bytes[byte_ofs] >> (((lx) & 1) * 4); \
					const uint32_t msb_bits = src_block.m_bytes[byte_ofs - 2] >> (((lx) & 1) * 4); \
					lookup_x[lx] = (lsb_bits & 0xF) | ((msb_bits & 0xF) << 4); }

				DO_LOOKUP(0);
				DO_LOOKUP(1);
				DO_LOOKUP(2);
				DO_LOOKUP(3);
#undef DO_LOOKUP

#define DO_PIX(lx, ly, w0, w1, w2, w3) \
				{ \
					int ca_l = a0 * w0 + a1 * w1 + a2 * w2 + a3 * w3; \
					int cb_l = b0 * w0 + b1 * w1 + b2 * w2 + b3 * w3; \
					int cl = block_colors_y_x16[g_etc1_x_selector_unpack[ly][lookup_x[lx]]]; \
					int dl = cb_l - ca_l; \
					int vl = cl - ca_l; \
					int p = vl * 16; \
					if (ca_l > cb_l) { p = -p; dl = -dl; } \
					uint32_t m = 0; \
					if (p > 3 * dl) m = (uint32_t)(1 << ((ly) * 8 + (lx) * 2)); \
					if (p > 8 * dl) m = (uint32_t)(2 << ((ly) * 8 + (lx) * 2)); \
					if (p > 13 * dl) m = (uint32_t)(3 << ((ly) * 8 + (lx) * 2)); \
					mod |= m; \
				}

				{
					const uint32_t ex = 0, ey = 0;
					const int a0 = e0[ex][ey], a1 = e0[ex + 1][ey], a2 = e0[ex][ey + 1], a3 = e0[ex + 1][ey + 1];
					const int b0 = e1[ex][ey], b1 = e1[ex + 1][ey], b2 = e1[ex][ey + 1], b3 = e1[ex + 1][ey + 1];
					DO_PIX(0, 0, 4, 4, 4, 4);
					DO_PIX(1, 0, 2, 6, 2, 6);
					DO_PIX(0, 1, 2, 2, 6, 6);
					DO_PIX(1, 1, 1, 3, 3, 9);
				}

				{
					const uint32_t ex = 1, ey = 0;
					const int a0 = e0[ex][ey], a1 = e0[ex + 1][ey], a2 = e0[ex][ey + 1], a3 = e0[ex + 1][ey + 1];
					const int b0 = e1[ex][ey], b1 = e1[ex + 1][ey], b2 = e1[ex][ey + 1], b3 = e1[ex + 1][ey + 1];
					DO_PIX(2, 0, 8, 0, 8, 0);
					DO_PIX(3, 0, 6, 2, 6, 2);
					DO_PIX(2, 1, 4, 0, 12, 0);
					DO_PIX(3, 1, 3, 1, 9, 3);
				}

				{
					const uint32_t ex = 0, ey = 1;
					const int a0 = e0[ex][ey], a1 = e0[ex + 1][ey], a2 = e0[ex][ey + 1], a3 = e0[ex + 1][ey + 1];
					const int b0 = e1[ex][ey], b1 = e1[ex + 1][ey], b2 = e1[ex][ey + 1], b3 = e1[ex + 1][ey + 1];
					DO_PIX(0, 2, 8, 8, 0, 0);
					DO_PIX(1, 2, 4, 12, 0, 0);
					DO_PIX(0, 3, 6, 6, 2, 2);
					DO_PIX(1, 3, 3, 9, 1, 3);
				}

				{
					const uint32_t ex = 1, ey = 1;
					const int a0 = e0[ex][ey], a1 = e0[ex + 1][ey], a2 = e0[ex][ey + 1], a3 = e0[ex + 1][ey + 1];
					const int b0 = e1[ex][ey], b1 = e1[ex + 1][ey], b2 = e1[ex][ey + 1], b3 = e1[ex + 1][ey + 1];
					DO_PIX(2, 2, 16, 0, 0, 0);
					DO_PIX(3, 2, 12, 4, 0, 0);
					DO_PIX(2, 3, 12, 0, 4, 0);
					DO_PIX(3, 3, 9, 3, 3, 1);
				}
#undef DO_PIX

				pDst_block->m_modulation = mod;

				e0[0][0] = e0[1][0]; e0[1][0] = e0[2][0];
				e0[0][1] = e0[1][1]; e0[1][1] = e0[2][1];
				e0[0][2] = e0[1][2]; e0[1][2] = e0[2][2];

				e1[0][0] = e1[1][0]; e1[1][0] = e1[2][0];
				e1[0][1] = e1[1][1]; e1[1][1] = e1[2][1];
				e1[0][2] = e1[1][2]; e1[1][2] = e1[2][2];

			} // x
		} // y
	}